

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O0

char * passphrase_callback(archive *a,void *_client_data)

{
  int *piVar1;
  char *pcVar2;
  char *p;
  void *_client_data_local;
  archive *a_local;
  
  if ((passphrase_buf == (char *)0x0) &&
     (passphrase_buf = (char *)malloc(0x400), passphrase_buf == (char *)0x0)) {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
    error("malloc()");
  }
  pcVar2 = lafe_readpassphrase("\nEnter password: ",passphrase_buf,0x400);
  if ((pcVar2 == (char *)0x0) && (piVar1 = __errno_location(), *piVar1 != 4)) {
    error("Error reading password");
  }
  return pcVar2;
}

Assistant:

static const char *
passphrase_callback(struct archive *a, void *_client_data)
{
	char *p;

	(void)a; /* UNUSED */
	(void)_client_data; /* UNUSED */

	if (passphrase_buf == NULL) {
		passphrase_buf = malloc(PPBUFF_SIZE);
		if (passphrase_buf == NULL) {
			errno = ENOMEM;
			error("malloc()");
		}
	}

	p = lafe_readpassphrase("\nEnter password: ", passphrase_buf,
		PPBUFF_SIZE);

	if (p == NULL && errno != EINTR)
		error("Error reading password");

	return p;
}